

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

MSize gola_new(LexState *ls,GCstr *name,uint8_t info,BCPos pc)

{
  VarInfo *pVVar1;
  BCPos in_ECX;
  undefined1 in_DL;
  lua_State *in_RSI;
  LexState *in_RDI;
  MSize vtop;
  FuncState *fs;
  MSize in_stack_ffffffffffffffd8;
  uint lim;
  FuncState *szp;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar2;
  
  uVar2 = CONCAT13(in_DL,in_stack_ffffffffffffffec);
  szp = in_RDI->fs;
  lim = in_RDI->vtop;
  if (in_RDI->sizevstack <= lim) {
    if (0xffc3 < in_RDI->sizevstack) {
      lj_lex_error(in_RDI,0,LJ_ERR_XLIMC,0xffc4);
    }
    pVVar1 = (VarInfo *)
             lj_mem_grow(in_RSI,(void *)CONCAT44(uVar2,in_ECX),(MSize *)szp,lim,
                         in_stack_ffffffffffffffd8);
    in_RDI->vstack = pVVar1;
  }
  in_RDI->vstack[lim].name.gcptr32 = (uint32_t)in_RSI;
  in_RDI->vstack[lim].startpc = in_ECX;
  in_RDI->vstack[lim].slot = (uint8_t)szp->nactvar;
  in_RDI->vstack[lim].info = (uint8_t)((uint)uVar2 >> 0x18);
  in_RDI->vtop = lim + 1;
  return lim;
}

Assistant:

static MSize gola_new(LexState *ls, GCstr *name, uint8_t info, BCPos pc)
{
  FuncState *fs = ls->fs;
  MSize vtop = ls->vtop;
  if (LJ_UNLIKELY(vtop >= ls->sizevstack)) {
    if (ls->sizevstack >= LJ_MAX_VSTACK)
      lj_lex_error(ls, 0, LJ_ERR_XLIMC, LJ_MAX_VSTACK);
    lj_mem_growvec(ls->L, ls->vstack, ls->sizevstack, LJ_MAX_VSTACK, VarInfo);
  }
  lj_assertFS(name == NAME_BREAK || lj_tab_getstr(fs->kt, name) != NULL,
	      "unanchored label name");
  /* NOBARRIER: name is anchored in fs->kt and ls->vstack is not a GCobj. */
  setgcref(ls->vstack[vtop].name, obj2gco(name));
  ls->vstack[vtop].startpc = pc;
  ls->vstack[vtop].slot = (uint8_t)fs->nactvar;
  ls->vstack[vtop].info = info;
  ls->vtop = vtop+1;
  return vtop;
}